

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffgkcl(char *tcard)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  int iVar8;
  bool bVar9;
  char card [20];
  byte local_38 [4];
  char cStack_34;
  char local_33;
  char cStack_32;
  char local_31;
  undefined1 auStack_30 [24];
  
  local_38[0] = 0;
  strncat((char *)local_38,tcard,8);
  sVar7 = strlen((char *)local_38);
  pbVar1 = local_38 + sVar7;
  pbVar1[0] = 0x20;
  pbVar1[1] = 0x20;
  pbVar1[2] = 0x20;
  pbVar1[3] = 0x20;
  pbVar1[4] = 0x20;
  pbVar1[5] = 0x20;
  pbVar1[6] = 0x20;
  pbVar1[7] = 0x20;
  auStack_30[sVar7] = 0;
  ffupch((char *)local_38);
  bVar2 = local_38[2];
  switch(local_38[0]) {
  case 0x42:
    if ((local_38[1] == 0x49) &&
       (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x20205849 &&
        CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x49))) == 0x49505449)) {
      return 10;
    }
    if (local_38[1] == 0x4c) {
      if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x2044454b &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x4c))) == 0x4b434f4c) {
        return 10;
      }
      if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x2020204b &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x4c))) == 0x4b4e414c) {
        return 0x28;
      }
    }
    if (local_38[1] == 0x5a) {
      if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) != 0x2020204f ||
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x5a))) != 0x4f52455a) {
        return 0x96;
      }
      return 0x1e;
    }
    if (local_38[1] == 0x55) {
      if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) != 0x20202054 ||
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x55))) != 0x54494e55) {
        return 0x96;
      }
      return 0x46;
    }
    if (local_38[1] != 0x53) {
      return 0x96;
    }
    if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) != 0x2020454c ||
        CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x53))) != 0x4c414353) {
      return 0x96;
    }
    return 0x1e;
  case 0x43:
    if ((local_38[1] == 0x4f) &&
       (CONCAT11(cStack_32,local_33) == 0x544e &&
        CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x4f))) == 0x454d4d4f)) {
      if (*tcard == 'C') {
        iVar6 = strncmp(tcard,"COMMENT   and Astrophysics\', volume 376, page 3",0x2f);
        if (iVar6 == 0) {
          return 10;
        }
        iVar6 = strncmp(tcard,"COMMENT   FITS (Flexible Image Transport System",0x2f);
        if (iVar6 == 0) {
          return 10;
        }
        iVar6 = strncmp(tcard,"COMMENT   Astrophysics Supplement Series v44/p3",0x2f);
        if (iVar6 == 0) {
          return 10;
        }
        iVar6 = strncmp(tcard,"COMMENT   Contact the NASA Science Office of St",0x2f);
        if (iVar6 == 0) {
          return 10;
        }
        iVar6 = strncmp(tcard,"COMMENT   FITS Definition document #100 and oth",0x2f);
        if (iVar6 == 0) {
          return 10;
        }
      }
      goto LAB_0013cee5;
    }
    if ((local_38[1] == 0x48) &&
       (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x4d55534b &&
        CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x48))) == 0x4b434548)) {
      return 100;
    }
    if ((local_38[1] == 0x4f) &&
       (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x45554e49 &&
        CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x4f))) == 0x49544e4f)) {
      return 0x8c;
    }
    if (local_38[1] == 0x55) {
      if (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x55))) != 0x54494e55)
      goto LAB_0013c5a7;
    }
    else if ((local_38[1] != 0x54) ||
            (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x54))) != 0x45505954)) {
LAB_0013c5a7:
      if (((local_38[1] != 0x52) ||
          ((((CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x52))) != 0x4c415652 &&
             (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x52))) != 0x58495052))
            && (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x52))) != 0x41544f52))
           && (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x52))) != 0x52454452)))
          ) && ((local_38[1] != 0x53 ||
                (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x53))) != 0x52455953)
                ))) {
        if (local_38[1] != 0x44) {
          return 0x96;
        }
        if (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x44))) != 0x544c4544)
        break;
      }
    }
    goto LAB_0013ce11;
  case 0x44:
    if (local_38[1] != 0x41) {
      return 0x96;
    }
    if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x204d5553 &&
        CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x41))) == 0x53415441) {
      return 100;
    }
    if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x204e494d &&
        CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x41))) == 0x4d415441) {
      return 0x3c;
    }
    if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x2058414d &&
        CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x41))) == 0x4d415441) {
      return 0x3c;
    }
    uVar5 = CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x41))) ^ 0x2d455441;
    iVar6 = 0x53424f2d;
    goto LAB_0013c476;
  case 0x45:
    if ((local_38[1] == 0x58) &&
       (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x2020444e &&
        CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x58))) == 0x4e455458)) {
      return 10;
    }
    if ((local_38[1] == 0x4e) &&
       (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x20202020 &&
        CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x4e))) == 0x2020444e)) {
      return 10;
    }
    if (local_38[1] == 0x58) {
      if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x20454d41 &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x58))) == 0x414e5458) {
        if (*tcard != 'E') {
          return 0x5a;
        }
        iVar6 = strncmp(tcard,"EXTNAME = \'COMPRESSED_IMAGE\'",0x1c);
        bVar9 = iVar6 == 0;
        iVar6 = 0x14;
        iVar8 = 0x5a;
        goto LAB_0013cef4;
      }
      if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x20205245 &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x58))) == 0x45565458) {
        return 0x5a;
      }
      if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x4c455645 &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x58))) == 0x454c5458) {
        return 0x5a;
      }
    }
    if (local_38[1] == 0x51) {
      if (CONCAT11(cStack_32,local_33) == 0x584f &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x51))) == 0x4e495551) {
        return 0x78;
      }
      if ((local_38[3] == 0x49 && CONCAT11(local_38[2],0x51) == 0x5551) &&
         ((byte)(cStack_34 - 0x30U) < 10)) {
        return 0x78;
      }
    }
    if (local_38[1] != 0x50) {
      return 0x96;
    }
    uVar5 = CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x50))) ^ 0x48434f50;
    iVar6 = 0x20202048;
LAB_0013c476:
    if (iVar6 != CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) || uVar5 != 0)
    {
      return 0x96;
    }
    return 0x78;
  case 0x46:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4f:
  case 0x51:
  case 0x55:
  case 0x56:
  case 0x59:
    goto switchD_0013c085_caseD_46;
  case 0x47:
    if (local_38[1] != 0x52) {
      if (local_38[1] != 0x43) {
        return 0x96;
      }
      if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) != 0x2020544e ||
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x43))) != 0x4e554f43) {
        return 0x96;
      }
      return 10;
    }
    uVar5 = CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x52))) ^ 0x50554f52;
    iVar6 = 0x20205350;
    goto LAB_0013c786;
  case 0x48:
    if (local_38[1] == 0x44) {
      if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x20454d41 &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x44))) == 0x414e5544) {
        return 0x5a;
      }
      if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x20205245 &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x44))) == 0x45565544) {
        return 0x5a;
      }
      if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x4c455645 &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x44))) == 0x454c5544) {
        return 0x5a;
      }
    }
    if (local_38[1] != 0x49) {
      return 0x96;
    }
    if (CONCAT11(cStack_32,local_33) != 0x5952 ||
        CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x49))) != 0x4f545349) {
      return 0x96;
    }
LAB_0013cee5:
    bVar9 = local_31 == ' ';
    iVar6 = 0x82;
    iVar8 = 0x96;
LAB_0013cef4:
    if (bVar9) {
      return iVar6;
    }
    return iVar8;
  case 0x4c:
    if (((local_38[1] == 0x4f) &&
        (CONCAT11(cStack_32,local_33) == 0x454c &&
         CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x4f))) == 0x4f504e4f)) ||
       ((local_38[1] == 0x41 &&
        (CONCAT11(cStack_32,local_33) == 0x454c &&
         CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x41))) == 0x4f505441)))) {
      return 0x6e;
    }
    if ((local_38[1] == 0x4f) &&
       (bVar2 = cStack_34, local_38[3] == 0x50 && CONCAT11(local_38[2],0x4f) == 0x4e4f)) break;
    if (local_38[1] != 0x41) {
      return 0x96;
    }
    uVar4 = CONCAT11(local_38[2],0x41) ^ 0x5441;
    local_38[3] = local_38[3] ^ 0x50;
    goto LAB_0013cbc5;
  case 0x4d:
    if (local_38[1] != 0x4a) {
      return 0x96;
    }
    iVar6 = 0x78;
    if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x2053424f &&
        CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x4a))) == 0x4f2d444a) {
      return 0x78;
    }
    iVar8 = CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x4a)));
    cStack_34 = local_33;
    if (iVar8 != 0x424f444a) {
      return 0x96;
    }
    goto LAB_0013c834;
  case 0x4e:
    if (local_38[1] != 0x41) {
      return 0x96;
    }
    if (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x41))) != 0x53495841) {
      return 0x96;
    }
    if (local_33 != ' ' && 9 < (byte)(local_33 - 0x30U)) {
      return 0x96;
    }
    return 10;
  case 0x50:
    if ((local_38[1] != 0x56) && (local_38[1] != 0x53)) {
      if (local_38[1] != 0x43) {
        return 0x96;
      }
      if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x2020544e &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x43))) == 0x4e554f43) {
        return 10;
      }
    }
    break;
  case 0x52:
    if (local_38[1] != 0x41) {
      return 0x96;
    }
    iVar6 = 0x78;
    if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x53595343 &&
        CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x41))) == 0x43454441) {
      return 0x78;
    }
    if (CONCAT11(cStack_32,local_33) == 0x5359 &&
        CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x41))) == 0x53454441) {
      return 0x78;
    }
    uVar4 = CONCAT11(local_38[2],0x41) ^ 0x4441;
    local_38[3] = local_38[3] ^ 0x45;
LAB_0013c827:
    if (local_38[3] != 0 || uVar4 != 0) {
      return 0x96;
    }
    goto LAB_0013c834;
  case 0x53:
    if (local_38[1] != 0x49) {
      return 0x96;
    }
    uVar5 = CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x49))) ^ 0x4c504d49;
    iVar6 = 0x2020454c;
    goto LAB_0013c786;
  case 0x54:
    if ((((local_38[1] == 0x54) &&
         (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x54))) == 0x45505954)) ||
        ((local_38[1] == 0x46 &&
         (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x46))) == 0x4d524f46)))) ||
       ((local_38[1] == 0x42 &&
        (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x42))) == 0x4c4f4342)))) {
      bVar2 = local_33 - 0x30;
      iVar6 = 10;
      goto LAB_0013cf2b;
    }
    if ((local_38[1] == 0x46) &&
       (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x2053444c &&
        CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x46))) == 0x4c454946)) {
      return 10;
    }
    if (local_38[1] == 0x4e) {
      if (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x4e))) == 0x4c4c554e) {
        bVar2 = local_33 - 0x30;
        iVar6 = 0x28;
        goto LAB_0013cf2b;
      }
    }
    else if ((local_38[1] == 0x48) &&
            (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x20202050 &&
             CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x48))) == 0x50414548)) {
      return 10;
    }
    if ((local_38[1] == 0x44) && (local_38[3] == 0x4d && CONCAT11(local_38[2],0x44) == 0x4944)) {
      bVar2 = cStack_34 - 0x30;
      iVar6 = 0x32;
      goto LAB_0013cf2b;
    }
    if ((local_38[1] == 0x55) &&
       (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x55))) == 0x54494e55)) {
      bVar2 = local_33 - 0x30;
      iVar6 = 0x46;
      goto LAB_0013cf2b;
    }
    if ((local_38[1] == 0x44) &&
       (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x44))) == 0x50534944)) {
      bVar2 = local_33 - 0x30;
      iVar6 = 0x50;
      goto LAB_0013cf2b;
    }
    if (((local_38[1] == 0x53) &&
        (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x53))) == 0x4c414353)) ||
       ((local_38[1] == 0x5a &&
        (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x5a))) == 0x4f52455a)))) {
      bVar2 = local_33 - 0x30;
      iVar6 = 0x1e;
      goto LAB_0013cf2b;
    }
    if (((local_38[1] == 0x4c) &&
        ((CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x4c))) == 0x4e494d4c ||
         (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x4c))) == 0x58414d4c)))) ||
       ((local_38[1] == 0x44 &&
        ((CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x44))) == 0x4e494d44 ||
         (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x44))) == 0x58414d44)))))) {
      bVar2 = local_33 - 0x30;
      iVar6 = 0x3c;
      goto LAB_0013cf2b;
    }
    if (local_38[1] == 0x43) {
      if (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x43))) == 0x50595443)
      goto LAB_0013ce11;
      bVar2 = cStack_34;
      if (local_38[3] != 0x59 || CONCAT11(local_38[2],0x43) != 0x5443) {
        if (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x43))) == 0x494e5543)
        goto LAB_0013ce11;
        if (local_38[3] != 0x4e || CONCAT11(local_38[2],0x43) != 0x5543) {
          if (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x43))) == 0x4c565243)
          goto LAB_0013ce11;
          if (local_38[3] != 0x56 || CONCAT11(local_38[2],0x43) != 0x5243) {
            if (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x43))) == 0x58505243)
            goto LAB_0013ce11;
            if (local_38[3] != 0x50 || CONCAT11(local_38[2],0x43) != 0x5243) {
              if ((CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x43))) ==
                   0x544f5243) ||
                 (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x43))) == 0x544c4443
                 )) goto LAB_0013ce11;
              if ((local_38[3] != 0x45 || CONCAT11(local_38[2],0x43) != 0x4443) &&
                 ((local_38[3] != 0x44 || CONCAT11(local_38[2],0x43) != 0x5243 &&
                  (local_38[3] != 0x59 || CONCAT11(local_38[2],0x43) != 0x5343))))
              goto LAB_0013cb05;
            }
          }
        }
      }
    }
    else {
LAB_0013cb05:
      if (((local_38[1] != 0x57) ||
          (bVar2 = cStack_34, local_38[3] != 0x53 || CONCAT11(local_38[2],0x57) != 0x4357)) &&
         ((((bVar2 = local_38[2], local_38[1] != 0x43 && (local_38[1] != 0x56)) &&
           (local_38[1] != 0x50)) && (local_38[1] != 0x53)))) {
        return 0x96;
      }
    }
    break;
  case 0x57:
    if (local_38[1] != 0x43) {
      return 0x96;
    }
    iVar6 = 0x6e;
    if (CONCAT11(cStack_32,local_33) == 0x5345 &&
        CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x43))) == 0x58415343) {
      return 0x6e;
    }
    if (CONCAT11(cStack_32,local_33) == 0x454d &&
        CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x43))) == 0x414e5343) {
      return 0x6e;
    }
    if (local_38[3] != 0x58 || CONCAT11(local_38[2],0x43) != 0x4143) {
      uVar4 = CONCAT11(local_38[2],0x43) ^ 0x5343;
      local_38[3] = local_38[3] ^ 0x4e;
      goto LAB_0013c827;
    }
LAB_0013c834:
    bVar2 = cStack_34 - 0x30;
    goto LAB_0013cf2b;
  case 0x58:
    if (local_38[1] != 0x54) {
      return 0x96;
    }
    uVar5 = CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x54))) ^ 0x534e4554;
    iVar6 = 0x4e4f4953;
LAB_0013c786:
    if (iVar6 != CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) || uVar5 != 0)
    {
      return 0x96;
    }
    return 10;
  case 0x5a:
    if (local_38[1] == 0x43) {
      if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x45505954 &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x43))) == 0x54504d43) {
        return 0x14;
      }
    }
    else if ((local_38[1] == 0x49) &&
            (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x20204547 &&
             CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x49))) == 0x47414d49)) {
      return 0x14;
    }
    if ((((local_38[1] != 0x4e) ||
         (cVar3 = local_33,
         CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x4e))) != 0x454d414e)) &&
        ((local_38[1] != 0x56 ||
         (cVar3 = cStack_34, local_38[3] != 0x4c || CONCAT11(local_38[2],0x56) != 0x4156)))) &&
       ((local_38[1] != 0x54 ||
        (cVar3 = local_33,
        CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x54))) != 0x454c4954)))) {
      if ((local_38[1] == 0x42) &&
         (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x20584950 &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x42))) == 0x50544942)) {
        return 0x14;
      }
      if ((local_38[1] == 0x4e) &&
         (local_33 == 'S' &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x4e))) == 0x4958414e)) {
        if (cStack_32 != ' ' && 9 < (byte)(cStack_32 - 0x30U)) {
          return 0x96;
        }
        return 0x14;
      }
      if ((local_38[1] == 0x53) &&
         (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x2020454c &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x53))) == 0x4c414353)) {
        return 0x14;
      }
      if ((local_38[1] == 0x5a) &&
         (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x2020204f &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x5a))) == 0x4f52455a)) {
        return 0x14;
      }
      if ((local_38[1] == 0x42) &&
         (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x20204b4e &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x42))) == 0x4e414c42)) {
        return 0x14;
      }
      if ((local_38[1] == 0x53) &&
         (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x20454c50 &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x53))) == 0x504d4953)) {
        return 0x14;
      }
      if ((local_38[1] == 0x54) &&
         (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x4e4f4953 &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x54))) == 0x534e4554)) {
        return 0x14;
      }
      if ((local_38[1] == 0x45) &&
         (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x20444e45 &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x45))) == 0x45545845)) {
        return 0x14;
      }
      if ((local_38[1] == 0x42) &&
         (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x44454b43 &&
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x42))) == 0x434f4c42)) {
        return 0x14;
      }
      if (local_38[1] < 0x50) {
        if (local_38[1] == 0x44) {
          if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x30524548 &&
              CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x44))) == 0x48544944) {
            return 0x14;
          }
          return 0x96;
        }
      }
      else {
        if (local_38[1] == 0x51) {
          if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) != 0x5a49544e ||
              CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x51))) != 0x4e415551) {
            return 0x96;
          }
          return 0x14;
        }
        if (local_38[1] != 0x50) {
          return 0x96;
        }
        if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) == 0x20544e55 &&
            CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x50))) == 0x554f4350) {
          return 0x14;
        }
      }
      if (local_38[1] != 0x47) {
        return 0x96;
      }
      if (CONCAT13(local_31,CONCAT12(cStack_32,CONCAT11(local_33,cStack_34))) != 0x20544e55 ||
          CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x47))) != 0x554f4347) {
        return 0x96;
      }
      return 0x14;
    }
    bVar2 = cVar3 - 0x30;
    iVar6 = 0x14;
    goto LAB_0013cf2b;
  default:
    if (local_38[0] == 0x20) {
      return 0x82;
    }
switchD_0013c085_caseD_46:
    if (9 < (byte)(local_38[0] - 0x30)) {
      return 0x96;
    }
    if ((local_38[1] != 0x56) && (local_38[1] != 0x53)) {
      if (local_38[1] == 0x43) {
        if (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x43))) == 0x50595443) {
LAB_0013ce11:
          bVar2 = local_33;
        }
        else {
          bVar2 = cStack_34;
          if (local_38[3] != 0x59 || CONCAT11(local_38[2],0x43) != 0x5443) {
            if (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x43))) == 0x494e5543)
            goto LAB_0013ce11;
            if (local_38[3] != 0x4e || CONCAT11(local_38[2],0x43) != 0x5543) {
              if (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x43))) == 0x4c565243
                 ) goto LAB_0013ce11;
              if (local_38[3] != 0x56 || CONCAT11(local_38[2],0x43) != 0x5243) {
                if (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x43))) ==
                    0x58505243) goto LAB_0013ce11;
                if (local_38[3] != 0x50 || CONCAT11(local_38[2],0x43) != 0x5243) {
                  if ((CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x43))) ==
                       0x544f5243) ||
                     (CONCAT13(cStack_34,CONCAT12(local_38[3],CONCAT11(local_38[2],0x43))) ==
                      0x544c4443)) goto LAB_0013ce11;
                  if ((local_38[3] != 0x45 || CONCAT11(local_38[2],0x43) != 0x4443) &&
                     (local_38[3] != 0x44 || CONCAT11(local_38[2],0x43) != 0x5243)) {
                    uVar4 = CONCAT11(local_38[2],0x43) ^ 0x5343;
                    local_38[3] = local_38[3] ^ 0x59;
LAB_0013cbc5:
                    bVar2 = cStack_34;
                    if (local_38[3] != 0 || uVar4 != 0) {
                      return 0x96;
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        if (9 < (byte)(local_38[1] - 0x30)) {
          return 0x96;
        }
        bVar2 = cStack_34;
        if ((local_38[3] != 0x43 || local_38[2] != 'P') &&
           (local_38[3] != 0x44 || local_38[2] != 'C')) {
          return 0x96;
        }
      }
    }
  }
  bVar2 = bVar2 - 0x30;
  iVar6 = 0x6e;
LAB_0013cf2b:
  if (9 < bVar2) {
    return 0x96;
  }
  return iVar6;
}

Assistant:

int ffgkcl(char *tcard)

/*
   Return the type classification of the input header record

   TYP_STRUC_KEY: SIMPLE, BITPIX, NAXIS, NAXISn, EXTEND, BLOCKED,
                  GROUPS, PCOUNT, GCOUNT, END
                  XTENSION, TFIELDS, TTYPEn, TBCOLn, TFORMn, THEAP,
                   and the first 4 COMMENT keywords in the primary array
                   that define the FITS format.

   TYP_CMPRS_KEY:
            The keywords used in the compressed image format
                  ZIMAGE, ZCMPTYPE, ZNAMEn, ZVALn, ZTILEn, 
                  ZBITPIX, ZNAXISn, ZSCALE, ZZERO, ZBLANK,
                  EXTNAME = 'COMPRESSED_IMAGE'
		  ZSIMPLE, ZTENSION, ZEXTEND, ZBLOCKED, ZPCOUNT, ZGCOUNT
		  ZQUANTIZ, ZDITHER0

   TYP_SCAL_KEY:  BSCALE, BZERO, TSCALn, TZEROn

   TYP_NULL_KEY:  BLANK, TNULLn

   TYP_DIM_KEY:   TDIMn

   TYP_RANG_KEY:  TLMINn, TLMAXn, TDMINn, TDMAXn, DATAMIN, DATAMAX

   TYP_UNIT_KEY:  BUNIT, TUNITn

   TYP_DISP_KEY:  TDISPn

   TYP_HDUID_KEY: EXTNAME, EXTVER, EXTLEVEL, HDUNAME, HDUVER, HDULEVEL

   TYP_CKSUM_KEY  CHECKSUM, DATASUM

   TYP_WCS_KEY:
           Primary array:
                  WCAXES, CTYPEn, CUNITn, CRVALn, CRPIXn, CROTAn, CDELTn
                  CDj_is, PVj_ms, LONPOLEs, LATPOLEs
  
           Pixel list:
                  TCTYPn, TCTYns, TCUNIn, TCUNns, TCRVLn, TCRVns, TCRPXn, TCRPks,
                  TCDn_k, TCn_ks, TPVn_m, TPn_ms, TCDLTn, TCROTn

           Bintable vector:
                  jCTYPn, jCTYns, jCUNIn, jCUNns, jCRVLn, jCRVns, iCRPXn, iCRPns,
                  jiCDn, jiCDns, jPVn_m, jPn_ms, jCDLTn, jCROTn
                
   TYP_REFSYS_KEY:
                   EQUINOXs, EPOCH, MJD-OBSs, RADECSYS, RADESYSs

   TYP_COMM_KEY:  COMMENT, HISTORY, (blank keyword)

   TYP_CONT_KEY:  CONTINUE

   TYP_USER_KEY:  all other keywords

*/ 
{
    char card[20], *card1, *card5;

    card[0] = '\0';
    strncat(card, tcard, 8);   /* copy the keyword name */
    strcat(card, "        "); /* append blanks to make at least 8 chars long */
    ffupch(card);  /* make sure it is in upper case */

    card1 = card + 1;  /* pointer to 2nd character */
    card5 = card + 5;  /* pointer to 6th character */

    /* the strncmp function is slow, so try to be more efficient */
    if (*card == 'Z')
    {
	if (FSTRNCMP (card1, "IMAGE  ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "CMPTYPE", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "NAME", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_CMPRS_KEY);
        }
	else if (FSTRNCMP (card1, "VAL", 3) == 0)
        {
            if (*(card + 4) >= '0' && *(card + 4) <= '9')
	        return (TYP_CMPRS_KEY);
        }
	else if (FSTRNCMP (card1, "TILE", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_CMPRS_KEY);
        }
	else if (FSTRNCMP (card1, "BITPIX ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "NAXIS", 5) == 0)
        {
            if ( ( *(card + 6) >= '0' && *(card + 6) <= '9' )
             || (*(card + 6) == ' ') )
	        return (TYP_CMPRS_KEY);
        }
	else if (FSTRNCMP (card1, "SCALE  ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "ZERO   ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "BLANK  ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "SIMPLE ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "TENSION", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "EXTEND ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "BLOCKED", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "PCOUNT ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "GCOUNT ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "QUANTIZ", 7) == 0)
	    return (TYP_CMPRS_KEY);
	else if (FSTRNCMP (card1, "DITHER0", 7) == 0)
	    return (TYP_CMPRS_KEY);
    }
    else if (*card == ' ')
    {
	return (TYP_COMM_KEY);
    }
    else if (*card == 'B')
    {
	if (FSTRNCMP (card1, "ITPIX  ", 7) == 0)
	    return (TYP_STRUC_KEY);
	if (FSTRNCMP (card1, "LOCKED ", 7) == 0)
	    return (TYP_STRUC_KEY);

	if (FSTRNCMP (card1, "LANK   ", 7) == 0)
	    return (TYP_NULL_KEY);

	if (FSTRNCMP (card1, "SCALE  ", 7) == 0)
	    return (TYP_SCAL_KEY);
	if (FSTRNCMP (card1, "ZERO   ", 7) == 0)
	    return (TYP_SCAL_KEY);

	if (FSTRNCMP (card1, "UNIT   ", 7) == 0)
	    return (TYP_UNIT_KEY);
    }
    else if (*card == 'C')
    {
	if (FSTRNCMP (card1, "OMMENT",6) == 0)
	{
          /* new comment string starting Oct 2001 */
	    if (FSTRNCMP (tcard, "COMMENT   and Astrophysics', volume 376, page 3",
              47) == 0)
	        return (TYP_STRUC_KEY);

         /* original COMMENT strings from 1993 - 2001 */
	    if (FSTRNCMP (tcard, "COMMENT   FITS (Flexible Image Transport System",
              47) == 0)
	        return (TYP_STRUC_KEY);
	    if (FSTRNCMP (tcard, "COMMENT   Astrophysics Supplement Series v44/p3",
              47) == 0)
	        return (TYP_STRUC_KEY);
	    if (FSTRNCMP (tcard, "COMMENT   Contact the NASA Science Office of St",
              47) == 0)
	        return (TYP_STRUC_KEY);
	    if (FSTRNCMP (tcard, "COMMENT   FITS Definition document #100 and oth",
              47) == 0)
	        return (TYP_STRUC_KEY);

            if (*(card + 7) == ' ')
	        return (TYP_COMM_KEY);
            else
                return (TYP_USER_KEY);
	}

	if (FSTRNCMP (card1, "HECKSUM", 7) == 0)
	    return (TYP_CKSUM_KEY);

	if (FSTRNCMP (card1, "ONTINUE", 7) == 0)
	    return (TYP_CONT_KEY);

	if (FSTRNCMP (card1, "TYPE",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "UNIT",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "RVAL",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "RPIX",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "ROTA",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "RDER",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "SYER",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "DELT",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (*card1 == 'D')
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
    }
    else if (*card == 'D')
    {
	if (FSTRNCMP (card1, "ATASUM ", 7) == 0)
	    return (TYP_CKSUM_KEY);
	if (FSTRNCMP (card1, "ATAMIN ", 7) == 0)
	    return (TYP_RANG_KEY);
	if (FSTRNCMP (card1, "ATAMAX ", 7) == 0)
	    return (TYP_RANG_KEY);
	if (FSTRNCMP (card1, "ATE-OBS", 7) == 0)
	    return (TYP_REFSYS_KEY);    }
    else if (*card == 'E')
    {
	if (FSTRNCMP (card1, "XTEND  ", 7) == 0)
	    return (TYP_STRUC_KEY);
	if (FSTRNCMP (card1, "ND     ", 7) == 0)
	    return (TYP_STRUC_KEY);
	if (FSTRNCMP (card1, "XTNAME ", 7) == 0)
	{
            /* check for special compressed image value */
            if (FSTRNCMP(tcard, "EXTNAME = 'COMPRESSED_IMAGE'", 28) == 0)
	      return (TYP_CMPRS_KEY);
            else
	      return (TYP_HDUID_KEY);
	}
	if (FSTRNCMP (card1, "XTVER  ", 7) == 0)
	    return (TYP_HDUID_KEY);
	if (FSTRNCMP (card1, "XTLEVEL", 7) == 0)
	    return (TYP_HDUID_KEY);

	if (FSTRNCMP (card1, "QUINOX", 6) == 0)
	    return (TYP_REFSYS_KEY);
	if (FSTRNCMP (card1, "QUI",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_REFSYS_KEY);
        }
	if (FSTRNCMP (card1, "POCH   ", 7) == 0)
	    return (TYP_REFSYS_KEY);
    }
    else if (*card == 'G')
    {
	if (FSTRNCMP (card1, "COUNT  ", 7) == 0)
	    return (TYP_STRUC_KEY);
	if (FSTRNCMP (card1, "ROUPS  ", 7) == 0)
	    return (TYP_STRUC_KEY);
    }
    else if (*card == 'H')
    {
	if (FSTRNCMP (card1, "DUNAME ", 7) == 0)
	    return (TYP_HDUID_KEY);
	if (FSTRNCMP (card1, "DUVER  ", 7) == 0)
	    return (TYP_HDUID_KEY);
	if (FSTRNCMP (card1, "DULEVEL", 7) == 0)
	    return (TYP_HDUID_KEY);

	if (FSTRNCMP (card1, "ISTORY",6) == 0)
        {
            if (*(card + 7) == ' ')
	        return (TYP_COMM_KEY);
            else
                return (TYP_USER_KEY);
        }
    }
    else if (*card == 'L')
    {
	if (FSTRNCMP (card1, "ONPOLE",6) == 0)
	    return (TYP_WCS_KEY);
	if (FSTRNCMP (card1, "ATPOLE",6) == 0)
	    return (TYP_WCS_KEY);
	if (FSTRNCMP (card1, "ONP",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "ATP",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
    }
    else if (*card == 'M')
    {
	if (FSTRNCMP (card1, "JD-OBS ", 7) == 0)
	    return (TYP_REFSYS_KEY);
	if (FSTRNCMP (card1, "JDOB",4) == 0)
        {
            if (*(card+5) >= '0' && *(card+5) <= '9')
	        return (TYP_REFSYS_KEY);
        }
    }
    else if (*card == 'N')
    {
	if (FSTRNCMP (card1, "AXIS", 4) == 0)
        {
            if ((*card5 >= '0' && *card5 <= '9')
             || (*card5 == ' '))
	        return (TYP_STRUC_KEY);
        }
    }
    else if (*card == 'P')
    {
	if (FSTRNCMP (card1, "COUNT  ", 7) == 0)
	    return (TYP_STRUC_KEY);
	if (*card1 == 'C')
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (*card1 == 'V')
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (*card1 == 'S')
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
    }
    else if (*card == 'R')
    {
	if (FSTRNCMP (card1, "ADECSYS", 7) == 0)
	    return (TYP_REFSYS_KEY);
	if (FSTRNCMP (card1, "ADESYS", 6) == 0)
	    return (TYP_REFSYS_KEY);
	if (FSTRNCMP (card1, "ADE",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_REFSYS_KEY);
        }
    }
    else if (*card == 'S')
    {
	if (FSTRNCMP (card1, "IMPLE  ", 7) == 0)
	    return (TYP_STRUC_KEY);
    }
    else if (*card == 'T')
    {
	if (FSTRNCMP (card1, "TYPE", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_STRUC_KEY);
        }
	else if (FSTRNCMP (card1, "FORM", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_STRUC_KEY);
        }
	else if (FSTRNCMP (card1, "BCOL", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_STRUC_KEY);
        }
	else if (FSTRNCMP (card1, "FIELDS ", 7) == 0)
	    return (TYP_STRUC_KEY);
	else if (FSTRNCMP (card1, "HEAP   ", 7) == 0)
	    return (TYP_STRUC_KEY);

	else if (FSTRNCMP (card1, "NULL", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_NULL_KEY);
        }

	else if (FSTRNCMP (card1, "DIM", 3) == 0)
        {
            if (*(card + 4) >= '0' && *(card + 4) <= '9')
 	        return (TYP_DIM_KEY);
        }

	else if (FSTRNCMP (card1, "UNIT", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_UNIT_KEY);
        }

	else if (FSTRNCMP (card1, "DISP", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_DISP_KEY);
        }

	else if (FSTRNCMP (card1, "SCAL", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_SCAL_KEY);
        }
	else if (FSTRNCMP (card1, "ZERO", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_SCAL_KEY);
        }

	else if (FSTRNCMP (card1, "LMIN", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_RANG_KEY);
        }
	else if (FSTRNCMP (card1, "LMAX", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_RANG_KEY);
        }
	else if (FSTRNCMP (card1, "DMIN", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_RANG_KEY);
        }
	else if (FSTRNCMP (card1, "DMAX", 4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_RANG_KEY);
        }

	else if (FSTRNCMP (card1, "CTYP",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CTY",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CUNI",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CUN",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRVL",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRV",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRPX",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRP",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CROT",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CDLT",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CDE",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRD",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CSY",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "WCS",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "C",1) == 0)
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "P",1) == 0)
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "V",1) == 0)
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "S",1) == 0)
        {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
        }
    }
    else if (*card == 'X')
    {
	if (FSTRNCMP (card1, "TENSION", 7) == 0)
	    return (TYP_STRUC_KEY);
    }
    else if (*card == 'W')
    {
	if (FSTRNCMP (card1, "CSAXES", 6) == 0)
	    return (TYP_WCS_KEY);
	if (FSTRNCMP (card1, "CSNAME", 6) == 0)
	    return (TYP_WCS_KEY);
	if (FSTRNCMP (card1, "CAX", 3) == 0)
	{
            if (*(card + 4) >= '0' && *(card + 4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CSN", 3) == 0)
	{
            if (*(card + 4) >= '0' && *(card + 4) <= '9')
	        return (TYP_WCS_KEY);
        }
    }
    
    else if (*card >= '0' && *card <= '9')
    {
      if (*card1 == 'C')
      {
        if (FSTRNCMP (card1, "CTYP",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CTY",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CUNI",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CUN",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRVL",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRV",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRPX",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRP",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CROT",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CDLT",4) == 0)
        {
            if (*card5 >= '0' && *card5 <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CDE",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CRD",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
	else if (FSTRNCMP (card1, "CSY",3) == 0)
        {
            if (*(card+4) >= '0' && *(card+4) <= '9')
	        return (TYP_WCS_KEY);
        }
      }
      else if (FSTRNCMP (card1, "V",1) == 0)
      {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
      }
      else if (FSTRNCMP (card1, "S",1) == 0)
      {
            if (*(card + 2) >= '0' && *(card + 2) <= '9')
	        return (TYP_WCS_KEY);
      }
      else if (*card1 >= '0' && *card1 <= '9')
      {   /* 2 digits at beginning of keyword */
	
	    if ( (*(card + 2) == 'P') && (*(card + 3) == 'C') )
	    {
               if (*(card + 4) >= '0' && *(card + 4) <= '9')
	        return (TYP_WCS_KEY);  /*  ijPCn keyword */
            }
	    else if ( (*(card + 2) == 'C') && (*(card + 3) == 'D') )
	    {
               if (*(card + 4) >= '0' && *(card + 4) <= '9')
	        return (TYP_WCS_KEY);  /*  ijCDn keyword */
            }
      }
      
    }
    
    return (TYP_USER_KEY);  /* by default all others are user keywords */
}